

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O0

Color4<float> Imath_3_2::hsv2rgb<float>(Color4<float> *hsv)

{
  float *in_RSI;
  Color4<float> *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar1;
  Color4<float> CVar2;
  Color4<double> c;
  Color4<double> v;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  Color4<double> local_30;
  
  Color4<double>::Color4
            (&local_30,(double)*in_RSI,(double)in_RSI[1],(double)in_RSI[2],(double)in_RSI[3]);
  Imath_3_2::hsv2rgb_d((Color4 *)&local_50);
  uVar1 = CONCAT44((int)((ulong)local_48 >> 0x20),(float)local_48);
  Color4<float>::Color4(in_RDI,(float)local_50,(float)local_48,(float)local_40,(float)local_38);
  CVar2.b = (float)(int)uVar1;
  CVar2.a = (float)(int)((ulong)uVar1 >> 0x20);
  CVar2.r = (float)(int)extraout_XMM0_Qa;
  CVar2.g = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return CVar2;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Color4<T>
                                   hsv2rgb (const Color4<T>& hsv) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        Color4<double> v = Color4<double> (
            hsv.r / float (std::numeric_limits<T>::max ()),
            hsv.g / float (std::numeric_limits<T>::max ()),
            hsv.b / float (std::numeric_limits<T>::max ()),
            hsv.a / float (std::numeric_limits<T>::max ()));
        Color4<double> c = hsv2rgb_d (v);
        return Color4<T> (
            (T) (c.r * std::numeric_limits<T>::max ()),
            (T) (c.g * std::numeric_limits<T>::max ()),
            (T) (c.b * std::numeric_limits<T>::max ()),
            (T) (c.a * std::numeric_limits<T>::max ()));
    }
    else
    {
        Color4<double> v = Color4<double> (hsv.r, hsv.g, hsv.b, hsv.a);
        Color4<double> c = hsv2rgb_d (v);
        return Color4<T> ((T) c.r, (T) c.g, (T) c.b, (T) c.a);
    }
}